

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O1

void __thiscall
pbrt::
InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
::InlinedVector(InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                *this,InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                      *other)

{
  ulong uVar1;
  size_t sVar2;
  ulong uVar3;
  
  (this->alloc).memoryResource = (other->alloc).memoryResource;
  this->ptr = (ParsedParameter **)0x0;
  this->nAlloc = 0;
  this->nStored = 0;
  sVar2 = other->nStored;
  this->nAlloc = other->nAlloc;
  this->nStored = sVar2;
  this->ptr = other->ptr;
  uVar1 = other->nStored;
  if (uVar1 < 9) {
    if (uVar1 != 0) {
      uVar3 = 0;
      do {
        *(undefined8 *)((long)&this->field_2 + uVar3 * 8) =
             *(undefined8 *)((long)&other->field_2 + uVar3 * 8);
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
    }
  }
  else {
    other->nStored = 0;
  }
  other->nAlloc = 0;
  other->ptr = (ParsedParameter **)0x0;
  return;
}

Assistant:

InlinedVector(InlinedVector &&other) : alloc(other.alloc) {
        nStored = other.nStored;
        nAlloc = other.nAlloc;
        ptr = other.ptr;
        if (other.nStored <= N)
            for (int i = 0; i < other.nStored; ++i)
                alloc.template construct<T>(fixed + i, std::move(other.fixed[i]));
        // Leave other.nStored as is, so that the detrius left after we
        // moved out of fixed has its destructors run...
        else
            other.nStored = 0;

        other.nAlloc = 0;
        other.ptr = nullptr;
    }